

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::ResidualCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *residual,int icase)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  int i;
  long lVar5;
  ulong uVar6;
  TPZTensor<double> obj;
  TPZDecomposed objdec;
  TPZTensor<double> local_2e8;
  TPZDecomposed local_290;
  
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  lVar5 = 0;
  TPZVec<double>::TPZVec(&local_2e8.fData.super_TPZVec<double>,0);
  local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f470;
  pdVar1 = local_2e8.fData.fExtAlloc;
  local_2e8.fData.super_TPZVec<double>.fNElements = 6;
  local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_2e8.fData.fExtAlloc[0] = 0.0;
  local_2e8.fData.fExtAlloc[1] = 0.0;
  local_2e8.fData.fExtAlloc[2] = 0.0;
  local_2e8.fData.fExtAlloc[3] = 0.0;
  local_2e8.fData.fExtAlloc[4] = 0.0;
  local_2e8.fData.fExtAlloc[5] = 0.0;
  pdVar2 = state->fElem;
  do {
    local_2e8.fData.fExtAlloc[lVar5] = pdVar2[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  pdVar2 = state->fElem;
  local_2e8.fData.fExtAlloc[1] = local_2e8.fData.fExtAlloc[1] * 0.5 + pdVar2[6] * 0.5;
  local_2e8.fData.fExtAlloc[2] = (local_2e8.fData.fExtAlloc[2] + pdVar2[7]) * 0.5;
  local_2e8.fData.fExtAlloc[4] = (local_2e8.fData.fExtAlloc[4] + pdVar2[8]) * 0.5;
  local_2e8.fData.super_TPZVec<double>.fStore = pdVar1;
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(&local_290,&local_2e8);
  (*(residual->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (residual,1,1);
  if ((uint)icase < 3) {
    uVar6 = (ulong)(uint)icase;
    if (((residual->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
       ((residual->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar2 = residual->fElem;
    *pdVar2 = local_290.fEigenvalues.super_TPZVec<double>.fStore[uVar6];
    iVar3 = 1;
    uVar4 = 0;
    do {
      if (((uVar6 != uVar4) && (gEigval[uVar4] == gEigval[uVar6])) &&
         (!NAN(gEigval[uVar4]) && !NAN(gEigval[uVar6]))) {
        iVar3 = iVar3 + 1;
        *pdVar2 = local_290.fEigenvalues.super_TPZVec<double>.fStore[uVar4] + *pdVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
    *pdVar2 = *pdVar2 / (double)iVar3;
  }
  TPZManVector<TPZTensor<double>,_3>::~TPZManVector(&local_290.fEigentensors);
  TPZManVector<TPZManVector<double,_3>,_3>::~TPZManVector(&local_290.fEigenvectors);
  TPZManVector<double,_3>::~TPZManVector(&local_290.fEigenvalues);
  if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore ==
      local_290.fGeometricMultiplicity.fExtAlloc) {
    local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore = (uint *)0x0;
  }
  local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fNAlloc = 0;
  local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0189f2e0;
  if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore != (uint *)0x0) {
    operator_delete__(local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore);
  }
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_0189f0b0;
  if (local_2e8.fData.super_TPZVec<double>.fStore == pdVar1) {
    local_2e8.fData.super_TPZVec<double>.fStore = (double *)0x0;
  }
  local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_2e8.fData.super_TPZVec<double>.fStore != (double *)0x0) {
    operator_delete__(local_2e8.fData.super_TPZVec<double>.fStore);
  }
  return;
}

Assistant:

static void ResidualCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &residual, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            obj[_XY_] = obj[_XY_]*0.5 + 0.5 * state(6);
            obj[_XZ_] = (obj[_XZ_] + state(7))*0.5;
            obj[_YZ_] = (obj[_YZ_] + state(8))*0.5;
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            residual.Resize(1, 1);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    residual(0, 0) = objdec.fEigenvalues[icase];
                    int numequal = 1;
                    for (int i = 0; i < 3; i++) {
                        if (i == icase) {
                            continue;
                        }
                        if (gEigval[i] == gEigval[icase]) {
                            numequal++;
                            residual(0) += objdec.fEigenvalues[i];
                        }
                    }
                    residual(0) /= numequal;
                }
                    break;

                default:
                    break;
            }
        }